

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_setglobals_unittest.cc
# Opt level: O3

void __thiscall
Test_SetGlobalValue_SetRootDirectory::Test_SetGlobalValue_SetRootDirectory
          (Test_SetGlobalValue_SetRootDirectory *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(SetGlobalValue, SetRootDirectory) {
  // Test to see that the Template static variables get created when you
  // first call the static function Template::SetRootDirectory().
  Template::SetTemplateRootDirectory("/some/directory/path");
  // We don't know if we appended a / or a \, so we test indirectly
  EXPECT_EQ(strlen("/some/directory/path")+1,   // assert they added a char
            Template::template_root_directory().size());
  EXPECT_EQ(0, memcmp(Template::template_root_directory().c_str(),
                      "/some/directory/path",
                      strlen("/some/directory/path")));
}